

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall
cmCTest::OpenOutputFile
          (cmCTest *this,string *path,string *name,cmGeneratedFileStream *stream,
          bool cm_zlib_compress)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  ostream *poVar4;
  long *plVar5;
  long *plVar6;
  string filename;
  string testingDir;
  ostringstream cmCTestLog_msg;
  long *local_208;
  long local_1f8;
  long lStack_1f0;
  string local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  pcVar1 = (this->BinaryDir)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + (this->BinaryDir)._M_string_length);
  std::__cxx11::string::append((char *)&local_1e8);
  if (path->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "/",path);
    std::__cxx11::string::_M_append((char *)&local_1e8,local_1a8._0_8_);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  bVar3 = cmsys::SystemTools::FileExists(local_1e8._M_dataplus._M_p);
  if (bVar3) {
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_1e8);
    if (bVar3) {
LAB_0025d065:
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_1e8._M_dataplus._M_p,
                 local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
      std::__cxx11::string::append(local_1a8);
      plVar5 = (long *)std::__cxx11::string::_M_append(local_1a8,(ulong)(name->_M_dataplus)._M_p);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_1f8 = *plVar6;
        lStack_1f0 = plVar5[3];
        local_208 = &local_1f8;
      }
      else {
        local_1f8 = *plVar6;
        local_208 = (long *)*plVar5;
      }
      lVar2 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      cmGeneratedFileStream::Open(stream,(char *)local_208,false,false);
      bVar3 = ((&(stream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                 field_0x20)
               [(long)(stream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream[-3]] & 5) == 0;
      if (bVar3) {
        if ((cm_zlib_compress) && (this->CompressXMLFiles == true)) {
          cmGeneratedFileStream::SetCompression(stream,true);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Problem opening file: ",0x16);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_208,lVar2);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0x3a8,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      goto LAB_0025d2f8;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"File ",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," is in the place of the testing directory",0x29);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x396,(char *)local_208,false);
  }
  else {
    bVar3 = cmsys::SystemTools::MakeDirectory(local_1e8._M_dataplus._M_p);
    if (bVar3) goto LAB_0025d065;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot create directory ",0x18);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x39f,(char *)local_208,false);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar3 = false;
LAB_0025d2f8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTest::OpenOutputFile(const std::string& path,
                     const std::string& name, cmGeneratedFileStream& stream,
                     bool compress)
{
  std::string testingDir = this->BinaryDir + "/Testing";
  if (!path.empty())
    {
    testingDir += "/" + path;
    }
  if ( cmSystemTools::FileExists(testingDir.c_str()) )
    {
    if ( !cmSystemTools::FileIsDirectory(testingDir) )
      {
      cmCTestLog(this, ERROR_MESSAGE, "File " << testingDir
                << " is in the place of the testing directory"
                << std::endl);
      return false;
      }
    }
  else
    {
    if ( !cmSystemTools::MakeDirectory(testingDir.c_str()) )
      {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot create directory " << testingDir
                << std::endl);
      return false;
      }
    }
  std::string filename = testingDir + "/" + name;
  stream.Open(filename.c_str());
  if( !stream )
    {
    cmCTestLog(this, ERROR_MESSAGE, "Problem opening file: " << filename
      << std::endl);
    return false;
    }
  if ( compress )
    {
    if ( this->CompressXMLFiles )
      {
      stream.SetCompression(true);
      }
    }
  return true;
}